

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLDSA.cpp
# Opt level: O2

bool __thiscall OSSLDSA::signFinal(OSSLDSA *this,ByteString *signature)

{
  OSSLDSAPrivateKey *this_00;
  bool bVar1;
  int iVar2;
  DSA *dsa;
  ulong uVar3;
  uchar *puVar4;
  size_t sVar5;
  DSA_SIG *a;
  BIGNUM *bn_s;
  BIGNUM *bn_r;
  ByteString hash;
  
  this_00 = (OSSLDSAPrivateKey *)(this->super_AsymmetricAlgorithm).currentPrivateKey;
  bVar1 = AsymmetricAlgorithm::signFinal(&this->super_AsymmetricAlgorithm,signature);
  if (!bVar1) {
    return false;
  }
  ByteString::ByteString(&hash);
  iVar2 = (*this->pCurrentHash->_vptr_HashAlgorithm[4])(this->pCurrentHash,&hash);
  if (this->pCurrentHash != (HashAlgorithm *)0x0) {
    (*this->pCurrentHash->_vptr_HashAlgorithm[1])();
  }
  this->pCurrentHash = (HashAlgorithm *)0x0;
  if ((char)iVar2 != '\0') {
    dsa = (DSA *)OSSLDSAPrivateKey::getOSSLKey(this_00);
    uVar3 = (**(code **)(*(long *)&this_00->super_DSAPrivateKey + 0x28))(this_00);
    ByteString::resize(signature,uVar3 & 0xffffffff);
    puVar4 = ByteString::operator[](signature,0);
    memset(puVar4,0,uVar3 & 0xffffffff);
    puVar4 = ByteString::operator[](&hash,0);
    sVar5 = ByteString::size(&hash);
    a = DSA_do_sign(puVar4,(int)sVar5,dsa);
    if (a != (DSA_SIG *)0x0) {
      DSA_SIG_get0(a);
      iVar2 = BN_num_bits((BIGNUM *)0x0);
      puVar4 = ByteString::operator[]
                         (signature,(ulong)(((uint)(uVar3 >> 1) & 0x7fffffff) + (iVar2 + 7) / -8));
      BN_bn2bin((BIGNUM *)0x0,puVar4);
      iVar2 = BN_num_bits((BIGNUM *)0x0);
      puVar4 = ByteString::operator[](signature,(ulong)(uint)((int)uVar3 + (iVar2 + 7) / -8));
      BN_bn2bin((BIGNUM *)0x0,puVar4);
      DSA_SIG_free(a);
      bVar1 = true;
      goto LAB_00150fca;
    }
  }
  bVar1 = false;
LAB_00150fca:
  ByteString::~ByteString(&hash);
  return bVar1;
}

Assistant:

bool OSSLDSA::signFinal(ByteString& signature)
{
	// Save necessary state before calling super class signFinal
	OSSLDSAPrivateKey* pk = (OSSLDSAPrivateKey*) currentPrivateKey;

	if (!AsymmetricAlgorithm::signFinal(signature))
	{
		return false;
	}

	ByteString hash;

	bool bFirstResult = pCurrentHash->hashFinal(hash);

	delete pCurrentHash;
	pCurrentHash = NULL;

	if (!bFirstResult)
	{
		return false;
	}

	DSA* dsa = pk->getOSSLKey();

	// Perform the signature operation
	unsigned int sigLen = pk->getOutputLength();
	signature.resize(sigLen);
	memset(&signature[0], 0, sigLen);
	DSA_SIG* sig = DSA_do_sign(&hash[0], hash.size(), dsa);
	if (sig == NULL)
		return false;
	// Store the 2 values with padding
	const BIGNUM* bn_r = NULL;
	const BIGNUM* bn_s = NULL;
	DSA_SIG_get0(sig, &bn_r, &bn_s);
	BN_bn2bin(bn_r, &signature[sigLen / 2 - BN_num_bytes(bn_r)]);
	BN_bn2bin(bn_s, &signature[sigLen - BN_num_bytes(bn_s)]);
	DSA_SIG_free(sig);
	return true;
}